

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
::dealloc(raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *this)

{
  size_t sVar1;
  slot_type *m;
  allocator_type *alloc;
  CommonFields *pCVar2;
  void *p;
  HashtablezInfoHandle local_11;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_10;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_local;
  
  local_10 = this;
  sVar1 = capacity(this);
  if (sVar1 != 0) {
    m = slot_array(this);
    sVar1 = capacity(this);
    SanitizerUnpoisonMemoryRegion(m,sVar1 << 3);
    infoz(this);
    HashtablezInfoHandle::Unregister(&local_11);
    alloc = alloc_ref(this);
    pCVar2 = common(this);
    p = CommonFields::backing_array_start(pCVar2);
    pCVar2 = common(this);
    sVar1 = CommonFields::alloc_size(pCVar2,8,8);
    Deallocate<8ul,std::allocator<google::protobuf::FileDescriptor_const*>>(alloc,p,sVar1);
    return;
  }
  __assert_fail("capacity() != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xdd5,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::dealloc() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
               );
}

Assistant:

inline void dealloc() {
    assert(capacity() != 0);
    // Unpoison before returning the memory to the allocator.
    SanitizerUnpoisonMemoryRegion(slot_array(), sizeof(slot_type) * capacity());
    infoz().Unregister();
    Deallocate<BackingArrayAlignment(alignof(slot_type))>(
        &alloc_ref(), common().backing_array_start(),
        common().alloc_size(sizeof(slot_type), alignof(slot_type)));
  }